

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O3

void __thiscall cppassert::internal::StackTraceImpl::collect(StackTraceImpl *this)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  ulong uVar4;
  CppDemangler demangler;
  CppDemangler local_50;
  BackTraceSymbol local_40;
  
  if (this->symbols_ != (char **)0x0) {
    free(this->symbols_);
  }
  local_50.funcNameSize_ = 0x100;
  pcVar2 = (char *)malloc(0x100);
  local_50.funcName_ = pcVar2;
  iVar1 = backtrace(this->backtrace_,0x100);
  this->backtraceSize_ = (long)iVar1;
  ppcVar3 = (char **)backtrace_symbols(this->backtrace_,iVar1);
  this->symbols_ = ppcVar3;
  if (2 < this->backtraceSize_) {
    ppcVar3 = &this->demangledSymbols_[2].allocated_;
    uVar4 = 2;
    do {
      if (this->symbols_ == (char **)0x0) {
        if (*ppcVar3 != (char *)0x0) {
          free(*ppcVar3);
          *ppcVar3 = (char *)0x0;
        }
        *ppcVar3 = (char *)0x0;
        ((BackTraceSymbol *)(ppcVar3 + -1))->symbol_ = "<unkown>";
        pcVar2 = "<unkown>";
      }
      else {
        BackTraceSymbol::createFromBacktraceStr(&local_40,this->symbols_[uVar4],&local_50);
        if (*ppcVar3 != (char *)0x0) {
          free(*ppcVar3);
          *ppcVar3 = (char *)0x0;
        }
        *ppcVar3 = local_40.allocated_;
        ((BackTraceSymbol *)(ppcVar3 + -1))->symbol_ = local_40.symbol_;
        pcVar2 = local_40.symbol_;
      }
      ppcVar3[-0x205] = (char *)this->backtrace_[uVar4];
      ppcVar3[-0x204] = pcVar2;
      uVar4 = uVar4 + 1;
      ppcVar3 = ppcVar3 + 2;
      pcVar2 = local_50.funcName_;
    } while (uVar4 < this->backtraceSize_);
  }
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
  }
  return;
}

Assistant:

void collect()
    {
        freeSymbols();
        CppDemangler demangler;
        backtraceSize_ = ::backtrace(backtrace_, BufferSize);
        symbols_ = ::backtrace_symbols(backtrace_, backtraceSize_);

        for(std::size_t i=cFramesToSkip; i<backtraceSize_; ++i)
        {
            if(symbols_)
            {
                demangledSymbols_[i]
                    = BackTraceSymbol::createFromBacktraceStr(symbols_[i]
                                                            , &demangler);
            }
            else
            {
                demangledSymbols_[i] = BackTraceSymbol();
            }

            frames_[i-cFramesToSkip] = StackTrace::StackFrame(backtrace_[i]
                                            , demangledSymbols_[i].symbol());
        }
    }